

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

void __thiscall MutableBuffer::~MutableBuffer(MutableBuffer *this)

{
  _Atomic_word *p_Var1;
  void *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__MutableBuffer_00157b40;
  if (((this->super_Buffer).owned == true) &&
     (__ptr = (this->super_Buffer).data, __ptr != (void *)0x0)) {
    free(__ptr);
  }
  p_Var2 = (this->super_Buffer).parent.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_Buffer).super_enable_shared_from_this<Buffer>._M_weak_this.
           super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Buffer::~Buffer() {
  if (owned && (data != nullptr)) {
    ::free(data);
  }
}